

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_callid(ASMState *as,IRIns *ir,IRCallID id)

{
  uint local_30;
  uint local_2c;
  IRRef args [2];
  CCallInfo *ci;
  IRCallID id_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  args = (IRRef  [2])(lj_ir_callinfo + id);
  local_30 = (uint)(ir->field_0).op1;
  local_2c = (uint)(ir->field_0).op2;
  asm_setupresult(as,ir,(CCallInfo *)args);
  asm_gencall(as,(CCallInfo *)args,&local_30);
  return;
}

Assistant:

static void asm_callid(ASMState *as, IRIns *ir, IRCallID id)
{
  const CCallInfo *ci = &lj_ir_callinfo[id];
  IRRef args[2];
  args[0] = ir->op1;
  args[1] = ir->op2;
  asm_setupresult(as, ir, ci);
  asm_gencall(as, ci, args);
}